

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O2

bool __thiscall Js::BigUInt::FAdd(BigUInt *this,BigUInt *pbi)

{
  uint uVar1;
  uint32 *puVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 *puVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint32 lu2;
  ulong uVar11;
  uint local_34;
  
  AssertValid(this,true);
  if (pbi == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x158,"(pbi)","pbi");
    if (!bVar4) goto LAB_00609b09;
    *puVar7 = 0;
  }
  AssertValid(pbi,true);
  if (this == pbi) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x159,"(this != pbi)","this != pbi");
    if (!bVar4) {
LAB_00609b09:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  local_34 = this->m_clu;
  uVar1 = pbi->m_clu;
  uVar10 = uVar1;
  if ((((int)uVar1 <= (int)local_34) ||
      (uVar10 = local_34, local_34 = uVar1, (int)uVar1 <= this->m_cluMax)) ||
     (bVar4 = FResize(this,uVar1 + 1), bVar4)) {
    lVar8 = 0;
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    uVar11 = (ulong)uVar10;
    lVar9 = uVar11 * 4;
    lu2 = 0;
    for (; lVar9 != lVar8; lVar8 = lVar8 + 4) {
      if (lu2 == 0) {
        iVar5 = 0;
      }
      else {
        iVar5 = NumberUtilities::AddLu((uint32 *)((long)this->m_prglu + lVar8),lu2);
      }
      iVar6 = NumberUtilities::AddLu
                        ((uint32 *)((long)this->m_prglu + lVar8),
                         *(uint32 *)((long)pbi->m_prglu + lVar8));
      lu2 = iVar6 + iVar5;
    }
    if (this->m_clu < pbi->m_clu) {
      lVar8 = uVar11 * 4;
      for (; (long)uVar11 < (long)(int)local_34; uVar11 = uVar11 + 1) {
        puVar2 = this->m_prglu;
        *(undefined4 *)((long)puVar2 + lVar8) = *(undefined4 *)((long)pbi->m_prglu + lVar8);
        if (lu2 == 0) {
          lu2 = 0;
        }
        else {
          lu2 = NumberUtilities::AddLu((uint32 *)((long)puVar2 + lVar8),lu2);
        }
        lVar8 = lVar8 + 4;
      }
      this->m_clu = local_34;
    }
    else {
      for (; (lu2 != 0 && ((long)uVar11 < (long)(int)local_34)); uVar11 = uVar11 + 1) {
        lu2 = NumberUtilities::AddLu((uint32 *)((long)this->m_prglu + lVar9),lu2);
        lVar9 = lVar9 + 4;
      }
    }
    if (lu2 != 0) {
      iVar5 = this->m_clu;
      if (this->m_cluMax <= iVar5) {
        bVar4 = FResize(this,iVar5 + 1);
        if (!bVar4) goto LAB_00609af8;
        iVar5 = this->m_clu;
      }
      this->m_clu = iVar5 + 1;
      this->m_prglu[iVar5] = lu2;
    }
    AssertValid(this,true);
    bVar4 = true;
  }
  else {
LAB_00609af8:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool BigUInt::FAdd(BigUInt *pbi)
    {
        AssertBi(this);
        AssertBi(pbi);
        Assert(this != pbi);

        int32 cluMax, cluMin;
        int32 ilu;
        int wCarry;

        if ((cluMax = m_clu) < (cluMin = pbi->m_clu))
        {
            cluMax = pbi->m_clu;
            cluMin = m_clu;
            if (cluMax > m_cluMax && !FResize(cluMax + 1))
                return false;
        }

        wCarry = 0;
        for (ilu = 0; ilu < cluMin; ilu++)
        {
            if (0 != wCarry)
                wCarry = NumberUtilities::AddLu(&m_prglu[ilu], wCarry);
            wCarry += NumberUtilities::AddLu(&m_prglu[ilu], pbi->m_prglu[ilu]);
        }

        if (m_clu < pbi->m_clu)
        {
            for (; ilu < cluMax; ilu++)
            {
                m_prglu[ilu] = pbi->m_prglu[ilu];
                if (0 != wCarry)
                    wCarry = NumberUtilities::AddLu(&m_prglu[ilu], wCarry);
            }
            m_clu = cluMax;
        }
        else
        {
            for (; 0 != wCarry && ilu < cluMax; ilu++)
                wCarry = NumberUtilities::AddLu(&m_prglu[ilu], wCarry);
        }

        if (0 != wCarry)
        {
            if (m_clu >= m_cluMax && !FResize(m_clu + 1))
                return false;
            m_prglu[m_clu++] = wCarry;
        }

        AssertBi(this);
        return true;
    }